

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O0

int get_q(AV1_COMP *cpi)

{
  long *in_RDI;
  double dVar1;
  int q;
  FRAME_TYPE frame_type;
  GF_GROUP *gf_group;
  aom_bit_depth_t in_stack_ffffffffffffffe8;
  undefined3 in_stack_ffffffffffffffec;
  
  dVar1 = av1_convert_qindex_to_q
                    (CONCAT13(*(undefined1 *)(*in_RDI + 0x1810 + (ulong)*(byte *)(in_RDI + 0xe258)),
                              in_stack_ffffffffffffffec),in_stack_ffffffffffffffe8);
  return (int)dVar1;
}

Assistant:

static int get_q(const AV1_COMP *cpi) {
  const GF_GROUP *gf_group = &cpi->ppi->gf_group;
  const FRAME_TYPE frame_type = gf_group->frame_type[cpi->gf_frame_index];
  const int q =
      (int)av1_convert_qindex_to_q(cpi->ppi->p_rc.avg_frame_qindex[frame_type],
                                   cpi->common.seq_params->bit_depth);
  return q;
}